

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *rhs)

{
  complex<double> *pcVar1;
  undefined1 auVar2 [16];
  double dVar3;
  complex<double> *__s;
  long lVar4;
  ulong __n;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_70;
  long local_60;
  double local_48;
  double dStack_40;
  
  lVar6 = this->size_;
  if (lVar6 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator*=(const SquareMatrix<T> &) [T = std::complex<double>]"
                 );
  }
  if (lVar6 != 0) {
    __n = lVar6 * lVar6 * 0x10;
    __s = (complex<double> *)operator_new__(-(ulong)((ulong)(lVar6 * lVar6) >> 0x3c != 0) | __n);
    memset(__s,0,__n);
    if (0 < lVar6) {
      local_60 = 0;
      local_70 = 0;
      do {
        if (0 < lVar6) {
          lVar5 = 0;
          do {
            if (0 < lVar6) {
              lVar7 = 0;
              lVar4 = 0;
              do {
                pcVar1 = (this->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                         lVar6 * lVar4 + lVar5;
                local_48 = *(double *)pcVar1->_M_value;
                dStack_40 = *(double *)(pcVar1->_M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_48,
                           (complex<double> *)
                           (((rhs->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                            _M_value + lVar7 + rhs->size_ * local_60));
                lVar6 = this->size_;
                dVar3 = *(double *)((long)__s[lVar5 + lVar6 * local_70]._M_value + 8) + dStack_40;
                auVar2._8_4_ = SUB84(dVar3,0);
                auVar2._0_8_ = *(double *)__s[lVar5 + lVar6 * local_70]._M_value + local_48;
                auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
                *(undefined1 (*) [16])__s[lVar5 + lVar6 * local_70]._M_value = auVar2;
                lVar4 = lVar4 + 1;
                lVar7 = lVar7 + 0x10;
              } while (lVar4 < lVar6);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < lVar6);
        }
        local_70 = local_70 + 1;
        local_60 = local_60 + 0x10;
      } while (local_70 < lVar6);
    }
    pcVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = __s;
    if (pcVar1 != (complex<double> *)0x0) {
      operator_delete__(pcVar1);
    }
    return this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x1e,
                "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }